

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::anon_unknown_0::StencilParamsBasicTestCase::initPrograms
          (StencilParamsBasicTestCase *this,SourceCollections *programCollection)

{
  ProgramSources *pPVar1;
  char *in_RCX;
  allocator<char> local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [40];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"VertexFetch.vert",&local_81);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_60);
  ShaderSourceProvider::getSource_abi_cxx11_
            (&local_80,
             (ShaderSourceProvider *)
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
             (Archive *)"vulkan/dynamic_state/VertexFetch.vert",in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)local_40,&local_80);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"VertexFetch.frag",&local_81);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_60);
  ShaderSourceProvider::getSource_abi_cxx11_
            (&local_80,
             (ShaderSourceProvider *)
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
             (Archive *)"vulkan/dynamic_state/VertexFetch.frag",in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_40,&local_80);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

virtual void initPrograms(vk::SourceCollections& programCollection) const
	{
		programCollection.glslSources.add("VertexFetch.vert") <<
			glu::VertexSource(ShaderSourceProvider::getSource(m_testCtx.getArchive(), "vulkan/dynamic_state/VertexFetch.vert"));

		programCollection.glslSources.add("VertexFetch.frag") <<
			glu::FragmentSource(ShaderSourceProvider::getSource(m_testCtx.getArchive(), "vulkan/dynamic_state/VertexFetch.frag"));
	}